

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O2

string * __thiscall
PhyloTree::getNewick_abi_cxx11_(string *__return_storage_ptr__,PhyloTree *this,bool branchLengths)

{
  iterator *this_00;
  ulong uVar1;
  pointer pbVar2;
  pointer pbVar3;
  undefined8 uVar4;
  bool bVar5;
  size_type sVar6;
  reference pPVar7;
  reference pbVar8;
  size_t sVar9;
  int __flags;
  void *__child_stack;
  int i_2;
  size_t i;
  ulong uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  Tools *pTVar11;
  void *in_R8;
  long lVar12;
  double d;
  reference rVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> edgesLeft;
  string str1;
  string local_1e8;
  Bipartition allLeaves;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strPieces;
  string local_130;
  string local_110;
  deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> corrEdges;
  string local_a0;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Deque_base(&strPieces.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
  std::_Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::_Deque_base
            (&corrEdges.super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>);
  if ((this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[2]>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&strPieces,
               (char (*) [2])0x137fd9);
    lVar12 = 0;
    uVar10 = 0;
    while( true ) {
      pbVar2 = (this->leaf2NumMap).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (this->leaf2NumMap).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (((long)pbVar3 - (long)pbVar2 >> 5) - 1U <= uVar10) break;
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&strPieces,(value_type *)((long)&(pbVar2->_M_dataplus)._M_p + lVar12));
      if (branchLengths) {
        pTVar11 = (Tools *)0x137fa1;
        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2]>
                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&strPieces,
                   (char (*) [2])0x137fa1);
        Tools::double_to_string_abi_cxx11_
                  ((string *)&allLeaves,pTVar11,
                   (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar10]);
        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&strPieces,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&allLeaves);
        std::__cxx11::string::~string((string *)&allLeaves);
      }
      std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[2]>
                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&strPieces,
                 (char (*) [2])",");
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + 0x20;
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&strPieces,pbVar3 + -1);
    pTVar11 = (Tools *)0x137fa1;
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[2]>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&strPieces,
               (char (*) [2])0x137fa1);
    Tools::double_to_string_abi_cxx11_
              ((string *)&allLeaves,pTVar11,
               (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish[-1]);
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&strPieces,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&allLeaves);
    std::__cxx11::string::~string((string *)&allLeaves);
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&strPieces,
               (char (*) [3])0x1388c1);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::deque(&local_80,&strPieces);
    std::__cxx11::string::string((string *)&local_110,"",(allocator *)&allLeaves);
    Tools::string_join(__return_storage_ptr__,&local_80,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque(&local_80);
  }
  else {
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(&edgesLeft,&this->edges);
    while( true ) {
      if (edgesLeft.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
          super__Vector_impl_data._M_start ==
          edgesLeft.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
          super__Vector_impl_data._M_finish) break;
      PhyloTreeEdge::PhyloTreeEdge
                ((PhyloTreeEdge *)&allLeaves,
                 edgesLeft.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
                 .super__Vector_impl_data._M_start);
      lVar12 = 0x48;
      sVar9 = 0;
      uVar10 = 1;
      while( true ) {
        __flags = 0x48;
        if ((ulong)(((long)edgesLeft.
                           super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)edgesLeft.
                          super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x48) <= uVar10) break;
        bVar5 = Bipartition::contains
                          (&allLeaves,
                           (Bipartition *)
                           ((long)&((edgesLeft.
                                     super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->super_Bipartition).
                                   _vptr_Bipartition + lVar12));
        if (bVar5) {
          PhyloTreeEdge::operator=
                    ((PhyloTreeEdge *)&allLeaves,
                     (PhyloTreeEdge *)
                     ((long)&((edgesLeft.
                               super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                               _M_impl.super__Vector_impl_data._M_start)->super_Bipartition).
                             _vptr_Bipartition + lVar12));
          sVar9 = uVar10;
        }
        uVar10 = uVar10 + 1;
        lVar12 = lVar12 + 0x48;
      }
      Tools::vector_remove_element_at_index<PhyloTreeEdge>(&edgesLeft,sVar9);
      PhyloTreeEdge::clone((PhyloTreeEdge *)&str1,(__fn *)&allLeaves,__child_stack,__flags,in_R8);
      this_00 = &corrEdges.super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                 super__Deque_impl_data._M_start;
      std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::emplace_front<PhyloTreeEdge>
                (&corrEdges,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str1);
      PhyloTreeEdge::~PhyloTreeEdge((PhyloTreeEdge *)&str1);
      std::__cxx11::string::string((string *)&str1,"",(allocator *)&local_270);
      std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_front<std::__cxx11::string>
                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&strPieces,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str1);
      std::__cxx11::string::~string((string *)&str1);
      std::__cxx11::string::string((string *)&str1,"(",(allocator *)&local_270);
      uVar10 = 1;
      while( true ) {
        sVar6 = std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size(&corrEdges);
        if (sVar6 <= uVar10) break;
        pPVar7 = std::_Deque_iterator<PhyloTreeEdge,_PhyloTreeEdge_&,_PhyloTreeEdge_*>::operator[]
                           (this_00,uVar10);
        bVar5 = Bipartition::contains(&allLeaves,&pPVar7->super_Bipartition);
        if (bVar5) {
          pbVar8 = std::
                   _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                   ::operator[](&strPieces.
                                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_start,uVar10);
          std::operator+(&local_270,pbVar8,",");
          std::__cxx11::string::append((string *)&str1);
          std::__cxx11::string::~string((string *)&local_270);
          pPVar7 = std::_Deque_iterator<PhyloTreeEdge,_PhyloTreeEdge_&,_PhyloTreeEdge_*>::operator[]
                             (this_00,uVar10);
          Bipartition::andNot(&allLeaves,&pPVar7->super_Bipartition);
          Tools::deque_remove_element_at_index<std::__cxx11::string>(&strPieces,uVar10);
          Tools::deque_remove_element_at_index<PhyloTreeEdge>(&corrEdges,uVar10);
        }
        else {
          uVar10 = uVar10 + 1;
        }
      }
      Bipartition::getPartition
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_270,
                 &allLeaves);
      uVar4 = local_270.field_2._8_8_;
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_270);
      if (uVar4 != 0) {
        lVar12 = 0;
        uVar10 = 0;
        while( true ) {
          Bipartition::getPartition
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_270,
                     &allLeaves);
          uVar4 = local_270.field_2._8_8_;
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_270);
          if ((ulong)uVar4 <= uVar10) break;
          Bipartition::getPartition
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_270,
                     &allLeaves);
          rVar13 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                              &local_270,uVar10);
          uVar1 = *rVar13.m_block;
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_270);
          if ((uVar1 & rVar13.m_mask) != 0) {
            pTVar11 = (Tools *)((long)&(((this->leaf2NumMap).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar12);
            std::__cxx11::string::append((string *)&str1);
            if (branchLengths) {
              Tools::double_to_string_abi_cxx11_
                        (&local_1e8,pTVar11,
                         (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar10]);
              std::operator+(&local_270,":",&local_1e8);
              std::__cxx11::string::append((string *)&str1);
              std::__cxx11::string::~string((string *)&local_270);
              std::__cxx11::string::~string((string *)&local_1e8);
            }
            std::__cxx11::string::append((char *)&str1);
          }
          uVar10 = uVar10 + 1;
          lVar12 = lVar12 + 0x20;
        }
      }
      std::__cxx11::string::string((string *)&local_a0,(string *)&str1);
      Tools::substring(&local_1e8,&local_a0,0,str1._M_string_length - 1);
      std::operator+(&local_270,&local_1e8,")");
      this_01 = &local_270;
      std::__cxx11::string::operator=((string *)&str1,(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_a0);
      if (branchLengths) {
        d = PhyloTreeEdge::getLength((PhyloTreeEdge *)&allLeaves);
        Tools::double_to_string_abi_cxx11_(&local_1e8,(Tools *)this_01,d);
        std::operator+(&local_270,":",&local_1e8);
        std::__cxx11::string::append((string *)&str1);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_front(&strPieces,&str1);
      std::__cxx11::string::~string((string *)&str1);
      PhyloTreeEdge::~PhyloTreeEdge((PhyloTreeEdge *)&allLeaves);
    }
    str1._M_dataplus._M_p = (pointer)&str1.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&str1,
               (char)((long)(this->leaf2NumMap).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->leaf2NumMap).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5));
    Bipartition::Bipartition(&allLeaves,&str1);
    std::__cxx11::string::~string((string *)&str1);
    std::__cxx11::string::string((string *)__return_storage_ptr__,"(",(allocator *)&str1);
    uVar10 = 0;
    while( true ) {
      sVar6 = std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size(&corrEdges);
      if (sVar6 <= uVar10) break;
      pbVar8 = std::
               _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
               ::operator[](&strPieces.
                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_start,uVar10);
      std::operator+(&str1,pbVar8,",");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&str1);
      pPVar7 = std::_Deque_iterator<PhyloTreeEdge,_PhyloTreeEdge_&,_PhyloTreeEdge_*>::operator[]
                         (&corrEdges.
                           super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                           super__Deque_impl_data._M_start,uVar10);
      Bipartition::andNot(&allLeaves,&pPVar7->super_Bipartition);
      uVar10 = uVar10 + 1;
    }
    bVar5 = Bipartition::isEmpty(&allLeaves);
    if (!bVar5) {
      lVar12 = 0;
      uVar10 = 0;
      while( true ) {
        sVar9 = Bipartition::size(&allLeaves);
        if (sVar9 <= uVar10) break;
        Bipartition::getPartition
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&str1,&allLeaves
                  );
        rVar13 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&str1,
                            uVar10);
        uVar1 = *rVar13.m_block;
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&str1);
        if ((uVar1 & rVar13.m_mask) != 0) {
          pTVar11 = (Tools *)((long)&(((this->leaf2NumMap).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar12);
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          if (branchLengths) {
            Tools::double_to_string_abi_cxx11_
                      (&local_270,pTVar11,
                       (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar10]);
            std::operator+(&str1,":",&local_270);
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&str1);
            std::__cxx11::string::~string((string *)&local_270);
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        uVar10 = uVar10 + 1;
        lVar12 = lVar12 + 0x20;
      }
    }
    std::__cxx11::string::string((string *)&local_130,(string *)__return_storage_ptr__);
    Tools::substring(&local_270,&local_130,0,__return_storage_ptr__->_M_string_length - 1);
    std::operator+(&str1,&local_270,");");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&str1);
    std::__cxx11::string::~string((string *)&str1);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_130);
    Bipartition::~Bipartition(&allLeaves);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&edgesLeft);
  }
  std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~deque(&corrEdges);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&strPieces);
  return __return_storage_ptr__;
}

Assistant:

string PhyloTree::getNewick(bool branchLengths) {
    deque<string> strPieces;
    deque<PhyloTreeEdge> corrEdges;

    if (edges.empty()) // star-tree
    {
        strPieces.emplace_back("(");
        for (size_t i = 0; i < leaf2NumMap.size() - 1; ++i) {
            strPieces.push_back(leaf2NumMap[i]);
            if (branchLengths) {
                strPieces.emplace_back(":");
                strPieces.push_back(Tools::double_to_string(leafEdgeLengths[i]));
            }
            strPieces.emplace_back(",");
        }
        strPieces.push_back(leaf2NumMap.back());
        strPieces.emplace_back(":");
        strPieces.push_back(Tools::double_to_string(leafEdgeLengths.back()));
        strPieces.emplace_back(");");
        return Tools::string_join(strPieces, "");
    }

    vector<PhyloTreeEdge> edgesLeft(edges);

    while (!edgesLeft.empty()) {
        auto minEdge = edgesLeft.front();
        size_t pos = 0;
        for (size_t i = 1; i < edgesLeft.size(); ++i) {
            if (minEdge.contains(edgesLeft[i])) {
                minEdge = edgesLeft[i];
                pos = i;
            }
        }
        Tools::vector_remove_element_at_index(edgesLeft, pos);

        corrEdges.push_front(minEdge.clone());
        strPieces.push_front("");

        // now we have a min element.
        // Start its Newick string.
        string str1 = "(";

        // Since we are allowing degenerate trees, there could be an arbitrary number of such edges.
        size_t k = 1;
        while (k < corrEdges.size()) {
            if (minEdge.contains(corrEdges[k])) {
                // add it to the string
                str1 += strPieces[k] + ",";

                // remove each leaf in this split from minEdge
                minEdge.andNot(corrEdges[k]);

                // remove this split and its corresponding string from the vectors
                Tools::deque_remove_element_at_index(strPieces, k);
                Tools::deque_remove_element_at_index(corrEdges, k);
            } else {
                k++;
            }
        }

        // add all the elements still in minEdge (These are leaves that weren't already added as part of
        // a min split contained by minEdge.)
        if (!minEdge.getPartition().empty()) {
            for (size_t i = 0; i < minEdge.getPartition().size(); i++) {
                if (minEdge.getPartition()[i]) {
                    str1 += leaf2NumMap[i];
                    if (branchLengths) {
                        str1 += ":" + Tools::double_to_string(leafEdgeLengths[i]);
                    }
                    str1 += ",";
                }
            }
        }
        // remove the last , and add the bracket and minEdge length
        str1 = Tools::substring(str1, 0, str1.length() - 1) + ")";
        if (branchLengths) {
            str1 += ":" + Tools::double_to_string(minEdge.getLength());
        }
        // store str1
        strPieces.push_front(str1);
    }

    // now we need to combine all edges in corrEdges and all remaining leaves
    Bipartition allLeaves = Bipartition(string(leaf2NumMap.size(), '1'));

    string newickString = "(";
    // add all the string pieces we've accumulated
    for (int i = 0; i < corrEdges.size(); i++) {
        newickString += strPieces[i] + ",";
        allLeaves.andNot(corrEdges[i]);
    }
    // add all remaining leaves
    if (!allLeaves.isEmpty()) {
        for (size_t i = 0; i < allLeaves.size(); i++) {
            if ((allLeaves.getPartition())[i]) {
                newickString += leaf2NumMap[i];
                if (branchLengths) {
                    newickString += ":" + Tools::double_to_string(leafEdgeLengths[i]);
                }
                newickString += ",";
            }
        }
    }

    // remove the last ,
    newickString = Tools::substring(newickString, 0, newickString.length() - 1) + ");";
    return newickString;
}